

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  value_type pLVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppLVar5;
  Net *in_RDI;
  int cret;
  int lret;
  Layer *layer;
  size_t i;
  ModelBinFromDataReader mb;
  int ret;
  DataReader *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ulong local_38;
  undefined1 local_30 [20];
  int local_1c;
  int local_4;
  
  bVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::empty
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)in_RDI);
  if (bVar2) {
    fprintf(_stderr,"network graph not ready\n");
    local_4 = -1;
  }
  else {
    local_1c = 0;
    ModelBinFromDataReader::ModelBinFromDataReader
              ((ModelBinFromDataReader *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    local_38 = 0;
    while( true ) {
      sVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size(&in_RDI->layers);
      if (sVar4 <= local_38) break;
      ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (&in_RDI->layers,local_38);
      pLVar1 = *ppLVar5;
      if (pLVar1 == (value_type)0x0) {
        fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.\n",
                local_38 & 0xffffffff);
        local_1c = -1;
        break;
      }
      iVar3 = (*pLVar1->_vptr_Layer[3])(pLVar1,local_30);
      if (iVar3 != 0) {
        fprintf(_stderr,"layer load_model %d failed\n",local_38 & 0xffffffff);
        local_1c = -1;
        break;
      }
      iVar3 = (*pLVar1->_vptr_Layer[4])(pLVar1,in_RDI);
      if (iVar3 != 0) {
        fprintf(_stderr,"layer create_pipeline %d failed\n",local_38 & 0xffffffff);
        local_1c = -1;
        break;
      }
      local_38 = local_38 + 1;
    }
    fuse_network(in_RDI);
    local_4 = local_1c;
    ModelBinFromDataReader::~ModelBinFromDataReader((ModelBinFromDataReader *)0x139a99);
  }
  return local_4;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (layers.empty())
    {
        fprintf(stderr, "network graph not ready\n");
        return -1;
    }

    // load file
    int ret = 0;

    ModelBinFromDataReader mb(dr);
    for (size_t i=0; i<layers.size(); i++)
    {
        Layer* layer = layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            fprintf(stderr, "load_model error at layer %d, parameter file has inconsistent content.\n", (int)i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
            fprintf(stderr, "layer load_model %d failed\n", (int)i);
            ret = -1;
            break;
        }

        int cret = layer->create_pipeline(opt);
        if (cret != 0)
        {
            fprintf(stderr, "layer create_pipeline %d failed\n", (int)i);
            ret = -1;
            break;
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        create_pipeline();

        upload_model();
    }
#endif // NCNN_VULKAN

    fuse_network();

    return ret;
}